

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void module_free_common(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ly_ctx *ctx;
  lys_revision *__ptr;
  lys_ident *plVar1;
  lys_feature *__ptr_00;
  lys_deviation *__ptr_01;
  ly_ctx *ctx_00;
  char **ppcVar2;
  lys_ext *__ptr_02;
  lys_deviate *plVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  int shallow;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  lys_node *plVar10;
  ulong uVar11;
  lys_node *plVar12;
  ulong uVar13;
  
  ctx = module->ctx;
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xb45,
                  "void module_free_common(struct lys_module *, void (*)(const struct lys_node *, void *))"
                 );
  }
  lVar7 = 0;
  for (uVar11 = 0; uVar11 < module->imp_size; uVar11 = uVar11 + 1) {
    lydict_remove(ctx,*(char **)(module->imp->rev + lVar7 + -8));
    lydict_remove(ctx,*(char **)(module->imp->rev + lVar7 + 0x18));
    lydict_remove(ctx,*(char **)(module->imp->rev + lVar7 + 0x20));
    lys_extension_instances_free
              (ctx,*(lys_ext_instance ***)(module->imp->rev + lVar7 + 0x10),
               (uint)(byte)module->imp->rev[lVar7 + 0xb],private_destructor);
    lVar7 = lVar7 + 0x38;
  }
  free(module->imp);
  if ((module->field_0x40 & 1) == 0) {
    plVar10 = module->data;
    while (plVar10 != (lys_node *)0x0) {
      plVar6 = plVar10->next;
      lys_node_free(plVar10,private_destructor,0);
      plVar10 = plVar6;
    }
  }
  lydict_remove(ctx,module->dsc);
  lydict_remove(ctx,module->ref);
  lydict_remove(ctx,module->org);
  lydict_remove(ctx,module->contact);
  lydict_remove(ctx,module->filepath);
  lVar7 = 0;
  for (uVar11 = 0; __ptr = module->rev, uVar11 < module->rev_size; uVar11 = uVar11 + 1) {
    lys_extension_instances_free
              (ctx,*(lys_ext_instance ***)(__ptr->date + lVar7 + 0x10),
               (uint)(byte)__ptr->date[lVar7 + 0xb],private_destructor);
    lydict_remove(ctx,*(char **)(module->rev->date + lVar7 + 0x18));
    lydict_remove(ctx,*(char **)(module->rev->date + lVar7 + 0x20));
    lVar7 = lVar7 + 0x28;
  }
  free(__ptr);
  lVar7 = 0x40;
  for (uVar11 = 0; uVar11 < module->ident_size; uVar11 = uVar11 + 1) {
    plVar1 = module->ident;
    if (plVar1 != (lys_ident *)0x0) {
      free(*(void **)(plVar1->padding + lVar7 + -0x24));
      ly_set_free(*(ly_set **)(plVar1->padding + lVar7 + -0x1c));
      lydict_remove(ctx,*(char **)(plVar1->padding + lVar7 + -0x5c));
      lydict_remove(ctx,*(char **)(plVar1->padding + lVar7 + -0x54));
      lydict_remove(ctx,*(char **)(plVar1->padding + lVar7 + -0x4c));
      lys_iffeature_free(ctx,*(lys_iffeature **)(plVar1->padding + lVar7 + -0x34),
                         plVar1->padding[lVar7 + -0x41],0,private_destructor);
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(plVar1->padding + lVar7 + -0x3c),
                 (uint)plVar1->padding[lVar7 + -0x42],private_destructor);
    }
    lVar7 = lVar7 + 0x48;
  }
  module->ident_size = 0;
  free(module->ident);
  lVar7 = 0;
  for (uVar11 = 0; uVar11 < module->tpdf_size; uVar11 = uVar11 + 1) {
    lys_tpdf_free(ctx,(lys_tpdf *)(module->tpdf->padding + lVar7 + -0x1d),private_destructor);
    lVar7 = lVar7 + 0x80;
  }
  free(module->tpdf);
  lys_extension_instances_free(ctx,module->ext,(uint)module->ext_size,private_destructor);
  lVar7 = 0;
  for (uVar11 = 0; uVar11 < module->augment_size; uVar11 = uVar11 + 1) {
    lys_augment_free(ctx,(lys_node_augment *)(module->augment->padding + lVar7 + -0x1c),
                     private_destructor);
    lVar7 = lVar7 + 0x68;
  }
  free(module->augment);
  lVar7 = 0;
  for (uVar11 = 0; __ptr_00 = module->features, uVar11 < module->features_size; uVar11 = uVar11 + 1)
  {
    lydict_remove(ctx,*(char **)(__ptr_00->padding + lVar7 + -0x1c));
    lydict_remove(ctx,*(char **)(__ptr_00->padding + lVar7 + -0x14));
    lydict_remove(ctx,*(char **)(__ptr_00->padding + lVar7 + -0xc));
    lys_iffeature_free(ctx,*(lys_iffeature **)(__ptr_00->padding + lVar7 + 0xc),
                       __ptr_00->padding[lVar7 + -1],0,private_destructor);
    ly_set_free(*(ly_set **)(__ptr_00->padding + lVar7 + 0x1c));
    lys_extension_instances_free
              (ctx,*(lys_ext_instance ***)(__ptr_00->padding + lVar7 + 4),
               (uint)__ptr_00->padding[lVar7 + -2],private_destructor);
    lVar7 = lVar7 + 0x40;
  }
  free(__ptr_00);
  uVar11 = 0;
  do {
    __ptr_01 = module->deviation;
    if (module->deviation_size <= uVar11) {
      free(__ptr_01);
      lVar7 = 0x28;
      for (uVar11 = 0; __ptr_02 = module->extensions, uVar11 < module->extensions_size;
          uVar11 = uVar11 + 1) {
        lydict_remove(ctx,*(char **)(__ptr_02->padding + lVar7 + -0x43));
        lydict_remove(ctx,*(char **)(__ptr_02->padding + lVar7 + -0x3b));
        lydict_remove(ctx,*(char **)(__ptr_02->padding + lVar7 + -0x33));
        lydict_remove(ctx,*(char **)(__ptr_02->padding + lVar7 + -0x1b));
        lys_extension_instances_free
                  (ctx,*(lys_ext_instance ***)(__ptr_02->padding + lVar7 + -0x23),
                   (uint)__ptr_02->padding[lVar7 + -0x29],private_destructor);
        lVar7 = lVar7 + 0x40;
      }
      free(__ptr_02);
      lydict_remove(ctx,module->name);
      lydict_remove(ctx,module->prefix);
      return;
    }
    ctx_00 = module->ctx;
    lydict_remove(ctx_00,__ptr_01[uVar11].target_name);
    lydict_remove(ctx_00,__ptr_01[uVar11].dsc);
    lydict_remove(ctx_00,__ptr_01[uVar11].ref);
    lys_extension_instances_free
              (ctx_00,__ptr_01[uVar11].ext,(uint)__ptr_01[uVar11].ext_size,private_destructor);
    if (__ptr_01[uVar11].deviate != (lys_deviate *)0x0) {
      plVar10 = __ptr_01[uVar11].orig_node;
      if (plVar10 != (lys_node *)0x0) {
        plVar6 = plVar10;
        if ((__ptr_01[uVar11].deviate)->mod == LY_DEVIATE_NO) {
LAB_0015acb6:
          shallow = 0;
          if (plVar6 != (lys_node *)0x0) {
            plVar6->module = module;
            plVar12 = plVar6;
            if (((plVar6->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
               (plVar4 = plVar6->child, plVar6->child != (lys_node *)0x0)) goto LAB_0015acf3;
            if (plVar6 == plVar10) goto LAB_0015ab6c;
            do {
              plVar4 = plVar12->next;
LAB_0015acf3:
              plVar6 = plVar4;
              if (plVar6 != (lys_node *)0x0) break;
              plVar12 = plVar12->parent;
              if (plVar12->nodetype == LYS_AUGMENT) {
                plVar12 = plVar12->prev;
              }
              plVar4 = lys_parent(plVar12);
              plVar5 = lys_parent(plVar10);
            } while (plVar4 != plVar5);
            goto LAB_0015acb6;
          }
        }
        else {
          plVar10->module = module;
          shallow = 1;
        }
LAB_0015ab6c:
        lys_node_free(plVar10,(_func_void_lys_node_ptr_void_ptr *)0x0,shallow);
      }
      for (uVar13 = 0; plVar3 = __ptr_01[uVar11].deviate, uVar13 < __ptr_01[uVar11].deviate_size;
          uVar13 = uVar13 + 1) {
        lys_extension_instances_free
                  (ctx_00,plVar3[uVar13].ext,(uint)plVar3[uVar13].ext_size,private_destructor);
        for (uVar8 = 0; ppcVar2 = __ptr_01[uVar11].deviate[uVar13].dflt,
            uVar8 < __ptr_01[uVar11].deviate[uVar13].dflt_size; uVar8 = uVar8 + 1) {
          lydict_remove(ctx_00,ppcVar2[uVar8]);
        }
        free(ppcVar2);
        lydict_remove(ctx_00,__ptr_01[uVar11].deviate[uVar13].units);
        plVar3 = __ptr_01[uVar11].deviate;
        if (plVar3[uVar13].mod == LY_DEVIATE_DEL) {
          lVar7 = 0;
          for (uVar8 = 0; uVar8 < plVar3[uVar13].must_size; uVar8 = uVar8 + 1) {
            lys_restr_free(ctx_00,(lys_restr *)((long)&(plVar3[uVar13].must)->expr + lVar7),
                           private_destructor);
            plVar3 = __ptr_01[uVar11].deviate;
            lVar7 = lVar7 + 0x38;
          }
          free(plVar3[uVar13].must);
          for (uVar8 = 0; plVar3 = __ptr_01[uVar11].deviate, uVar8 < plVar3[uVar13].unique_size;
              uVar8 = uVar8 + 1) {
            for (uVar9 = 0; ppcVar2 = plVar3[uVar13].unique[uVar8].expr,
                uVar9 < plVar3[uVar13].unique[uVar8].expr_size; uVar9 = uVar9 + 1) {
              lydict_remove(ctx_00,ppcVar2[uVar9]);
              plVar3 = __ptr_01[uVar11].deviate;
            }
            free(ppcVar2);
          }
          free(plVar3[uVar13].unique);
        }
      }
      free(plVar3);
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static void
module_free_common(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    struct ly_ctx *ctx;
    struct lys_node *next, *iter;
    unsigned int i;

    assert(module->ctx);
    ctx = module->ctx;

    /* just free the import array, imported modules will stay in the context */
    for (i = 0; i < module->imp_size; i++) {
        lydict_remove(ctx, module->imp[i].prefix);
        lydict_remove(ctx, module->imp[i].dsc);
        lydict_remove(ctx, module->imp[i].ref);
        lys_extension_instances_free(ctx, module->imp[i].ext, module->imp[i].ext_size, private_destructor);
    }
    free(module->imp);

    /* submodules don't have data tree, the data nodes
     * are placed in the main module altogether */
    if (!module->type) {
        LY_TREE_FOR_SAFE(module->data, next, iter) {
            lys_node_free(iter, private_destructor, 0);
        }
    }

    lydict_remove(ctx, module->dsc);
    lydict_remove(ctx, module->ref);
    lydict_remove(ctx, module->org);
    lydict_remove(ctx, module->contact);
    lydict_remove(ctx, module->filepath);

    /* revisions */
    for (i = 0; i < module->rev_size; i++) {
        lys_extension_instances_free(ctx, module->rev[i].ext, module->rev[i].ext_size, private_destructor);
        lydict_remove(ctx, module->rev[i].dsc);
        lydict_remove(ctx, module->rev[i].ref);
    }
    free(module->rev);

    /* identities */
    for (i = 0; i < module->ident_size; i++) {
        lys_ident_free(ctx, &module->ident[i], private_destructor);
    }
    module->ident_size = 0;
    free(module->ident);

    /* typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        lys_tpdf_free(ctx, &module->tpdf[i], private_destructor);
    }
    free(module->tpdf);

    /* extension instances */
    lys_extension_instances_free(ctx, module->ext, module->ext_size, private_destructor);

    /* augment */
    for (i = 0; i < module->augment_size; i++) {
        lys_augment_free(ctx, &module->augment[i], private_destructor);
    }
    free(module->augment);

    /* features */
    for (i = 0; i < module->features_size; i++) {
        lys_feature_free(ctx, &module->features[i], private_destructor);
    }
    free(module->features);

    /* deviations */
    for (i = 0; i < module->deviation_size; i++) {
        lys_deviation_free(module, &module->deviation[i], private_destructor);
    }
    free(module->deviation);

    /* extensions */
    for (i = 0; i < module->extensions_size; i++) {
        lys_extension_free(ctx, &module->extensions[i], private_destructor);
    }
    free(module->extensions);

    lydict_remove(ctx, module->name);
    lydict_remove(ctx, module->prefix);
}